

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall trackerboy::Player::step(Player *this)

{
  long lVar1;
  undefined8 *puVar2;
  Frame frame;
  anon_class_16_2_f7cbea5a local_30;
  Frame local_20;
  
  if (this->mPlaying == true) {
    local_20.halted = true;
    local_20.startedNewRow = false;
    local_20.startedNewPattern = false;
    local_20.speed = '\0';
    local_20.time = 0;
    local_20.order._0_1_ = 0;
    local_20._9_7_ = 0;
    Engine::step(this->mEngine,&local_20);
    if (local_20.halted == true) {
      this->mPlaying = false;
    }
    else {
      lVar1 = (long)(char)*(__index_type *)
                           ((long)&(this->mContext).
                                   super__Variant_base<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                                   .
                                   super__Move_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                                   .
                                   super__Copy_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                                   .
                                   super__Move_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                                   .
                                   super__Copy_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                                   .
                                   super__Variant_storage_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                           + 0x28);
      local_30.this = this;
      local_30.frame = &local_20;
      if (lVar1 == -1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = &PTR__exception_002012c8;
        puVar2[1] = "std::visit: variant is valueless";
        __cxa_throw(puVar2,&std::bad_variant_access::typeinfo,std::exception::~exception);
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/build_O3/_deps/libtrackerboy-src/src/export/Player.cpp:112:24)_&&,_std::variant<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>_&>
        ::_S_vtable._M_arr[lVar1]._M_data)(&local_30,&this->mContext);
    }
  }
  return;
}

Assistant:

void Player::step() {
    if (mPlaying) {
        Frame frame;
        mEngine.step(frame);

        if (frame.halted) {
            mPlaying = false;
        } else {
            // check if we have another step via our context variant
            std::visit([this, &frame](auto&& ctx) {
                using T = std::decay_t<decltype(ctx)>;

                if constexpr (std::is_same_v<T, LoopContext>) {
                    if (frame.startedNewPattern) {
                        if (ctx.visits[frame.order]++ == ctx.loopAmount) {
                            mPlaying = false;
                        }
                        ctx.currentPattern = frame.order;
                    }
                } else if constexpr (std::is_same_v<T, DurationContext>) {
                    if (++ctx.frameCounter >= ctx.framesToPlay) {
                        mPlaying = false;
                    }
                } else {
                    // T is monostate, should not happen
                    mPlaying = false; // stop playing, class was incorrectly constructed
                }
                

            }, mContext);

        }


    }
}